

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeFileEnding(JUnitTestOutput *this)

{
  long *in_RDI;
  char *in_stack_ffffffffffffff68;
  char *otherBuffer;
  SimpleString *in_stack_ffffffffffffff70;
  SimpleString *this_00;
  char local_68 [16];
  SimpleString local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [32];
  undefined1 local_18 [24];
  
  SimpleString::SimpleString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_18);
  SimpleString::~SimpleString((SimpleString *)0x17797a);
  (**(code **)(*in_RDI + 0x100))(local_38,in_RDI,in_RDI[4] + 0x60);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_38);
  SimpleString::~SimpleString((SimpleString *)0x1779bf);
  SimpleString::SimpleString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_48);
  SimpleString::~SimpleString((SimpleString *)0x1779f7);
  this_00 = &local_58;
  SimpleString::SimpleString(this_00,in_stack_ffffffffffffff68);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,this_00);
  SimpleString::~SimpleString((SimpleString *)0x177a2f);
  otherBuffer = local_68;
  SimpleString::SimpleString(this_00,otherBuffer);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,otherBuffer);
  SimpleString::~SimpleString((SimpleString *)0x177a65);
  return;
}

Assistant:

void JUnitTestOutput::writeFileEnding()
{
    writeToFile("<system-out>");
    writeToFile(encodeXmlText(impl_->stdOutput_));
    writeToFile("</system-out>\n");
    writeToFile("<system-err></system-err>\n");
    writeToFile("</testsuite>\n");
}